

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O2

bool __thiscall Pig::getDecimal(Pig *this,double *result)

{
  bool bVar1;
  double dVar2;
  string s;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  bVar1 = getDecimal(this,&local_30);
  if (bVar1) {
    dVar2 = strtod(local_30._M_dataplus._M_p,(char **)0x0);
    *result = dVar2;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool Pig::getDecimal (double& result)
{
  std::string s;
  if (getDecimal (s))
  {
    result = std::strtod (s.c_str (), NULL);
    return true;
  }

  return false;
}